

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall el::Configuration::~Configuration(Configuration *this)

{
  ~Configuration(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Configuration(void) {
  }